

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_array.c
# Opt level: O3

int main(void)

{
  int iVar1;
  
  UnityBegin(
            "/workspace/llm4binary/github/license_all_cmakelists_25/FSMaxB[P]cJSON/tests/print_array.c"
            );
  UnityDefaultTestRun(print_array_should_print_empty_arrays,"print_array_should_print_empty_arrays",
                      0x5f);
  UnityDefaultTestRun(print_array_should_print_arrays_with_one_element,
                      "print_array_should_print_arrays_with_one_element",0x60);
  UnityDefaultTestRun(print_array_should_print_arrays_with_multiple_elements,
                      "print_array_should_print_arrays_with_multiple_elements",0x61);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

main(void)
{
    /* initialize cJSON item */
    UNITY_BEGIN();

    RUN_TEST(print_array_should_print_empty_arrays);
    RUN_TEST(print_array_should_print_arrays_with_one_element);
    RUN_TEST(print_array_should_print_arrays_with_multiple_elements);

    return UNITY_END();
}